

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O2

void ncnn::softmax(float *_ptr,int elemcount,int elempack)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  float afVar5 [16];
  float afVar6 [16];
  float afVar7 [16];
  float afVar8 [16];
  float afVar9 [16];
  float afVar10 [16];
  float afVar11 [16];
  float afVar12 [16];
  float afVar13 [16];
  float afVar14 [16];
  int i;
  int iVar15;
  float *ptr;
  undefined1 (*pauVar16) [64];
  int iVar17;
  int i_1;
  float *ptr_1;
  float *ptr_2;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  __m128 _max0;
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar68 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar69 [64];
  undefined1 auVar20 [16];
  
  afVar14 = ::_ps512_cephes_exp_p5;
  afVar13 = ::_ps512_cephes_exp_p4;
  afVar12 = ::_ps512_cephes_exp_p3;
  afVar11 = ::_ps512_cephes_exp_p2;
  afVar10 = ::_ps512_cephes_exp_p1;
  afVar9 = ::_ps512_cephes_exp_p0;
  afVar8 = ::_ps512_cephes_LOG2EF;
  afVar7 = ::_ps512_exp_lo;
  afVar6 = ::_ps512_exp_hi;
  afVar5 = ::_ps512_1;
  iVar17 = elemcount * elempack;
  auVar33 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
  pauVar16 = (undefined1 (*) [64])_ptr;
  for (iVar15 = 0; iVar15 + 0xf < iVar17; iVar15 = iVar15 + 0x10) {
    auVar33 = vmaxps_avx512f(auVar33,*pauVar16);
    pauVar16 = pauVar16 + 1;
  }
  auVar32._8_4_ = 0xff7fffff;
  auVar32._0_8_ = 0xff7fffffff7fffff;
  auVar32._12_4_ = 0xff7fffff;
  auVar32._16_4_ = 0xff7fffff;
  auVar32._20_4_ = 0xff7fffff;
  auVar32._24_4_ = 0xff7fffff;
  auVar32._28_4_ = 0xff7fffff;
  for (; iVar15 + 7 < iVar17; iVar15 = iVar15 + 8) {
    auVar32 = vmaxps_avx(auVar32,*(undefined1 (*) [32])*pauVar16);
    pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x20);
  }
  auVar24._8_4_ = 0xff7fffff;
  auVar24._0_8_ = 0xff7fffffff7fffff;
  auVar24._12_4_ = 0xff7fffff;
  for (; iVar15 + 3 < iVar17; iVar15 = iVar15 + 4) {
    auVar24 = vmaxps_avx(auVar24,*(undefined1 (*) [16])*pauVar16);
    pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x10);
  }
  auVar68 = ZEXT464(0xff7fffff);
  for (; iVar15 < iVar17; iVar15 = iVar15 + 1) {
    auVar18 = vmaxss_avx512f(auVar68._0_16_,ZEXT416(*(uint *)*pauVar16));
    auVar68 = ZEXT1664(auVar18);
    pauVar16 = (undefined1 (*) [64])(*pauVar16 + 4);
  }
  auVar26 = vextractf64x4_avx512f(auVar33,1);
  auVar45 = auVar33._0_32_;
  if (elempack == 8) {
    auVar32 = vmaxps_avx(auVar32,auVar45);
    auVar32 = vmaxps_avx(auVar32,auVar26);
    auVar33 = vinsertf64x4_avx512f(ZEXT3264(auVar32),auVar32,1);
  }
  else {
    if (elempack == 1) {
      auVar26 = vmaxps_avx(auVar45,auVar26);
      auVar18 = vmaxps_avx(auVar26._0_16_,auVar26._16_16_);
      auVar23 = vshufpd_avx(auVar18,auVar18,3);
      auVar18 = vmaxps_avx(auVar18,auVar23);
      auVar23 = vmovshdup_avx(auVar18);
      auVar23 = vmaxss_avx(auVar18,auVar23);
      auVar18 = vmaxps_avx(auVar32._16_16_,auVar32._0_16_);
      auVar25 = vshufpd_avx(auVar18,auVar18,3);
      auVar18 = vmaxps_avx(auVar18,auVar25);
      auVar25 = vmovshdup_avx(auVar18);
      auVar18 = vmaxss_avx(auVar18,auVar25);
      auVar25 = vmaxss_avx512f(auVar18,auVar68._0_16_);
      auVar18 = vshufpd_avx(auVar24,auVar24,3);
      auVar24 = vmaxps_avx(auVar24,auVar18);
      auVar18 = vmovshdup_avx(auVar24);
      auVar24 = vmaxss_avx(auVar24,auVar18);
      auVar24 = vmaxss_avx(auVar24,auVar25);
      auVar24 = vmaxss_avx512f(auVar24,auVar23);
      auVar68 = ZEXT1664(auVar24);
      auVar33 = vbroadcastss_avx512f(auVar24);
      auVar24 = auVar33._0_16_;
      bVar4 = true;
      bVar3 = false;
      auVar32 = auVar33._0_32_;
      goto LAB_0031198a;
    }
    if (elempack == 4) {
      auVar32 = vmaxps_avx(auVar32,auVar45);
      auVar32 = vmaxps_avx(auVar32,auVar26);
      auVar24 = vmaxps_avx(auVar24,auVar32._0_16_);
      auVar24 = vmaxps_avx(auVar24,auVar32._16_16_);
      auVar32._16_16_ = auVar24;
      auVar32._0_16_ = auVar24;
      auVar33 = vshuff64x2_avx512f(ZEXT1664(auVar24),ZEXT1664(auVar24),0);
      bVar3 = true;
      bVar4 = false;
      goto LAB_0031198a;
    }
  }
  bVar4 = false;
  bVar3 = false;
LAB_0031198a:
  auVar34 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar35 = vxorps_avx512dq(auVar34,(undefined1  [64])::_ps512_cephes_exp_C1);
  auVar34 = vxorps_avx512dq(auVar34,(undefined1  [64])::_ps512_cephes_exp_C2);
  auVar18 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar69 = ZEXT1664(auVar18);
  iVar15 = 0;
  auVar36 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
  pauVar16 = (undefined1 (*) [64])_ptr;
  for (; iVar15 + 0xf < iVar17; iVar15 = iVar15 + 0x10) {
    auVar37 = vsubps_avx512f(*pauVar16,auVar33);
    auVar37 = vminps_avx512f(auVar37,(undefined1  [64])afVar6);
    auVar37 = vmaxps_avx512f(auVar37,(undefined1  [64])afVar7);
    auVar38 = vfmadd213ps_avx512f((undefined1  [64])afVar8,auVar37,(undefined1  [64])afVar14);
    auVar39 = vrndscaleps_avx512f(auVar38,1);
    uVar2 = vcmpps_avx512f(auVar38,auVar39,1);
    auVar38 = vsubps_avx512f(auVar39,(undefined1  [64])afVar5);
    bVar1 = (bool)((byte)uVar2 & 1);
    in_ZMM18._0_4_ = (uint)bVar1 * auVar38._0_4_ | (uint)!bVar1 * auVar39._0_4_;
    bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
    in_ZMM18._4_4_ = (uint)bVar1 * auVar38._4_4_ | (uint)!bVar1 * auVar39._4_4_;
    bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
    in_ZMM18._8_4_ = (uint)bVar1 * auVar38._8_4_ | (uint)!bVar1 * auVar39._8_4_;
    bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
    in_ZMM18._12_4_ = (uint)bVar1 * auVar38._12_4_ | (uint)!bVar1 * auVar39._12_4_;
    bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
    in_ZMM18._16_4_ = (uint)bVar1 * auVar38._16_4_ | (uint)!bVar1 * auVar39._16_4_;
    bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
    in_ZMM18._20_4_ = (uint)bVar1 * auVar38._20_4_ | (uint)!bVar1 * auVar39._20_4_;
    bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
    in_ZMM18._24_4_ = (uint)bVar1 * auVar38._24_4_ | (uint)!bVar1 * auVar39._24_4_;
    bVar1 = (bool)((byte)(uVar2 >> 7) & 1);
    in_ZMM18._28_4_ = (uint)bVar1 * auVar38._28_4_ | (uint)!bVar1 * auVar39._28_4_;
    bVar1 = (bool)((byte)(uVar2 >> 8) & 1);
    in_ZMM18._32_4_ = (uint)bVar1 * auVar38._32_4_ | (uint)!bVar1 * auVar39._32_4_;
    bVar1 = (bool)((byte)(uVar2 >> 9) & 1);
    in_ZMM18._36_4_ = (uint)bVar1 * auVar38._36_4_ | (uint)!bVar1 * auVar39._36_4_;
    bVar1 = (bool)((byte)(uVar2 >> 10) & 1);
    in_ZMM18._40_4_ = (uint)bVar1 * auVar38._40_4_ | (uint)!bVar1 * auVar39._40_4_;
    bVar1 = (bool)((byte)(uVar2 >> 0xb) & 1);
    in_ZMM18._44_4_ = (uint)bVar1 * auVar38._44_4_ | (uint)!bVar1 * auVar39._44_4_;
    bVar1 = (bool)((byte)(uVar2 >> 0xc) & 1);
    in_ZMM18._48_4_ = (uint)bVar1 * auVar38._48_4_ | (uint)!bVar1 * auVar39._48_4_;
    bVar1 = (bool)((byte)(uVar2 >> 0xd) & 1);
    in_ZMM18._52_4_ = (uint)bVar1 * auVar38._52_4_ | (uint)!bVar1 * auVar39._52_4_;
    bVar1 = (bool)((byte)(uVar2 >> 0xe) & 1);
    in_ZMM18._56_4_ = (uint)bVar1 * auVar38._56_4_ | (uint)!bVar1 * auVar39._56_4_;
    bVar1 = SUB81(uVar2 >> 0xf,0);
    in_ZMM18._60_4_ = (uint)bVar1 * auVar38._60_4_ | (uint)!bVar1 * auVar39._60_4_;
    auVar37 = vfmadd231ps_avx512f(auVar37,in_ZMM18,auVar35);
    auVar37 = vfmadd231ps_avx512f(auVar37,in_ZMM18,auVar34);
    auVar38 = vmulps_avx512f(auVar37,auVar37);
    auVar39 = vfmadd213ps_avx512f(auVar37,(undefined1  [64])afVar9,(undefined1  [64])afVar10);
    auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,(undefined1  [64])afVar11);
    auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,(undefined1  [64])afVar12);
    auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,(undefined1  [64])afVar13);
    auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,(undefined1  [64])afVar14);
    in_ZMM19 = vfmadd213ps_avx512f(auVar39,auVar38,auVar37);
    auVar37 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar5);
    auVar38 = vcvttps2dq_avx512f(in_ZMM18);
    auVar38 = vpaddd_avx512f(auVar36,auVar38);
    auVar38 = vpslld_avx512f(auVar38,0x17);
    auVar37 = vmulps_avx512f(auVar37,auVar38);
    *pauVar16 = auVar37;
    auVar69 = vaddps_avx512f(auVar37,auVar69);
    pauVar16 = pauVar16 + 1;
  }
  auVar18 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar33 = ZEXT1664(auVar18);
  auVar26._8_4_ = 0x42b0c0a5;
  auVar26._0_8_ = 0x42b0c0a542b0c0a5;
  auVar26._12_4_ = 0x42b0c0a5;
  auVar26._16_4_ = 0x42b0c0a5;
  auVar26._20_4_ = 0x42b0c0a5;
  auVar26._24_4_ = 0x42b0c0a5;
  auVar26._28_4_ = 0x42b0c0a5;
  auVar45._8_4_ = 0xc2b0c0a5;
  auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
  auVar45._12_4_ = 0xc2b0c0a5;
  auVar45._16_4_ = 0xc2b0c0a5;
  auVar45._20_4_ = 0xc2b0c0a5;
  auVar45._24_4_ = 0xc2b0c0a5;
  auVar45._28_4_ = 0xc2b0c0a5;
  auVar47._8_4_ = 0x3f000000;
  auVar47._0_8_ = 0x3f0000003f000000;
  auVar47._12_4_ = 0x3f000000;
  auVar47._16_4_ = 0x3f000000;
  auVar47._20_4_ = 0x3f000000;
  auVar47._24_4_ = 0x3f000000;
  auVar47._28_4_ = 0x3f000000;
  auVar50._8_4_ = 0x3fb8aa3b;
  auVar50._0_8_ = 0x3fb8aa3b3fb8aa3b;
  auVar50._12_4_ = 0x3fb8aa3b;
  auVar50._16_4_ = 0x3fb8aa3b;
  auVar50._20_4_ = 0x3fb8aa3b;
  auVar50._24_4_ = 0x3fb8aa3b;
  auVar50._28_4_ = 0x3fb8aa3b;
  auVar52._8_4_ = 0xbf800000;
  auVar52._0_8_ = 0xbf800000bf800000;
  auVar52._12_4_ = 0xbf800000;
  auVar52._16_4_ = 0xbf800000;
  auVar52._20_4_ = 0xbf800000;
  auVar52._24_4_ = 0xbf800000;
  auVar52._28_4_ = 0xbf800000;
  auVar54._8_4_ = 0x3f318000;
  auVar54._0_8_ = 0x3f3180003f318000;
  auVar54._12_4_ = 0x3f318000;
  auVar54._16_4_ = 0x3f318000;
  auVar54._20_4_ = 0x3f318000;
  auVar54._24_4_ = 0x3f318000;
  auVar54._28_4_ = 0x3f318000;
  auVar56._8_4_ = 0x395e8083;
  auVar56._0_8_ = 0x395e8083395e8083;
  auVar56._12_4_ = 0x395e8083;
  auVar56._16_4_ = 0x395e8083;
  auVar56._20_4_ = 0x395e8083;
  auVar56._24_4_ = 0x395e8083;
  auVar56._28_4_ = 0x395e8083;
  auVar58._8_4_ = 0x39506967;
  auVar58._0_8_ = 0x3950696739506967;
  auVar58._12_4_ = 0x39506967;
  auVar58._16_4_ = 0x39506967;
  auVar58._20_4_ = 0x39506967;
  auVar58._24_4_ = 0x39506967;
  auVar58._28_4_ = 0x39506967;
  auVar60._8_4_ = 0x3ab743ce;
  auVar60._0_8_ = 0x3ab743ce3ab743ce;
  auVar60._12_4_ = 0x3ab743ce;
  auVar60._16_4_ = 0x3ab743ce;
  auVar60._20_4_ = 0x3ab743ce;
  auVar60._24_4_ = 0x3ab743ce;
  auVar60._28_4_ = 0x3ab743ce;
  auVar62._8_4_ = 0x3c088908;
  auVar62._0_8_ = 0x3c0889083c088908;
  auVar62._12_4_ = 0x3c088908;
  auVar62._16_4_ = 0x3c088908;
  auVar62._20_4_ = 0x3c088908;
  auVar62._24_4_ = 0x3c088908;
  auVar62._28_4_ = 0x3c088908;
  auVar64._8_4_ = 0x3d2aa9c1;
  auVar64._0_8_ = 0x3d2aa9c13d2aa9c1;
  auVar64._12_4_ = 0x3d2aa9c1;
  auVar64._16_4_ = 0x3d2aa9c1;
  auVar64._20_4_ = 0x3d2aa9c1;
  auVar64._24_4_ = 0x3d2aa9c1;
  auVar64._28_4_ = 0x3d2aa9c1;
  auVar66._8_4_ = 0x3e2aaaaa;
  auVar66._0_8_ = 0x3e2aaaaa3e2aaaaa;
  auVar66._12_4_ = 0x3e2aaaaa;
  auVar66._16_4_ = 0x3e2aaaaa;
  auVar66._20_4_ = 0x3e2aaaaa;
  auVar66._24_4_ = 0x3e2aaaaa;
  auVar66._28_4_ = 0x3e2aaaaa;
  auVar67._8_4_ = 0x3f800000;
  auVar67._0_8_ = 0x3f8000003f800000;
  auVar67._12_4_ = 0x3f800000;
  auVar67._16_4_ = 0x3f800000;
  auVar67._20_4_ = 0x3f800000;
  auVar67._24_4_ = 0x3f800000;
  auVar67._28_4_ = 0x3f800000;
  for (; auVar31 = auVar33._0_32_, iVar15 + 7 < iVar17; iVar15 = iVar15 + 8) {
    auVar30 = vsubps_avx(*(undefined1 (*) [32])*pauVar16,auVar32);
    auVar30 = vminps_avx(auVar30,auVar26);
    auVar30 = vmaxps_avx(auVar30,auVar45);
    auVar27 = vfmadd231ps_avx512vl(auVar47,auVar30,auVar50);
    auVar28 = vrndscaleps_avx512vl(auVar27,1);
    uVar2 = vcmpps_avx512vl(auVar27,auVar28,1);
    auVar27 = vaddps_avx512vl(auVar28,auVar52);
    bVar1 = (bool)((byte)uVar2 & 1);
    auVar29._0_4_ = (uint)bVar1 * auVar27._0_4_ | (uint)!bVar1 * auVar28._0_4_;
    bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
    auVar29._4_4_ = (uint)bVar1 * auVar27._4_4_ | (uint)!bVar1 * auVar28._4_4_;
    bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
    auVar29._8_4_ = (uint)bVar1 * auVar27._8_4_ | (uint)!bVar1 * auVar28._8_4_;
    bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
    auVar29._12_4_ = (uint)bVar1 * auVar27._12_4_ | (uint)!bVar1 * auVar28._12_4_;
    bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
    auVar29._16_4_ = (uint)bVar1 * auVar27._16_4_ | (uint)!bVar1 * auVar28._16_4_;
    bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
    auVar29._20_4_ = (uint)bVar1 * auVar27._20_4_ | (uint)!bVar1 * auVar28._20_4_;
    bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
    auVar29._24_4_ = (uint)bVar1 * auVar27._24_4_ | (uint)!bVar1 * auVar28._24_4_;
    bVar1 = SUB81(uVar2 >> 7,0);
    auVar29._28_4_ = (uint)bVar1 * auVar27._28_4_ | (uint)!bVar1 * auVar28._28_4_;
    auVar30 = vfmsub231ps_avx512vl(auVar30,auVar29,auVar54);
    auVar30 = vfmsub231ps_avx512vl(auVar30,auVar29,auVar56);
    auVar27 = vmulps_avx512vl(auVar30,auVar30);
    auVar28 = vfmadd213ps_avx512vl(auVar58,auVar30,auVar60);
    auVar28 = vfmadd213ps_avx512vl(auVar28,auVar30,auVar62);
    auVar28 = vfmadd213ps_avx512vl(auVar28,auVar30,auVar64);
    auVar28 = vfmadd213ps_avx512vl(auVar28,auVar30,auVar66);
    auVar28 = vfmadd213ps_avx512vl(auVar28,auVar30,auVar47);
    auVar27 = vfmadd213ps_avx512vl(auVar28,auVar27,auVar30);
    in_ZMM18 = ZEXT3264(auVar27);
    auVar30 = vcvttps2dq_avx512vl(auVar29);
    auVar30 = vpslld_avx2(auVar30,0x17);
    auVar30 = vpaddd_avx2(auVar30,auVar67);
    auVar30 = vfmadd213ps_avx512vl(auVar30,auVar27,auVar30);
    *(undefined1 (*) [32])*pauVar16 = auVar30;
    auVar31 = vaddps_avx512vl(auVar30,auVar31);
    auVar33 = ZEXT3264(auVar31);
    pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x20);
  }
  auVar18 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar23._8_4_ = 0x42b0c0a5;
  auVar23._0_8_ = 0x42b0c0a542b0c0a5;
  auVar23._12_4_ = 0x42b0c0a5;
  auVar25._8_4_ = 0xc2b0c0a5;
  auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
  auVar25._12_4_ = 0xc2b0c0a5;
  auVar44._8_4_ = 0x3f000000;
  auVar44._0_8_ = 0x3f0000003f000000;
  auVar44._12_4_ = 0x3f000000;
  auVar46._8_4_ = 0x3fb8aa3b;
  auVar46._0_8_ = 0x3fb8aa3b3fb8aa3b;
  auVar46._12_4_ = 0x3fb8aa3b;
  auVar49._8_4_ = 0xbf800000;
  auVar49._0_8_ = 0xbf800000bf800000;
  auVar49._12_4_ = 0xbf800000;
  auVar51._8_4_ = 0x3f318000;
  auVar51._0_8_ = 0x3f3180003f318000;
  auVar51._12_4_ = 0x3f318000;
  auVar53._8_4_ = 0x395e8083;
  auVar53._0_8_ = 0x395e8083395e8083;
  auVar53._12_4_ = 0x395e8083;
  auVar55._8_4_ = 0x39506967;
  auVar55._0_8_ = 0x3950696739506967;
  auVar55._12_4_ = 0x39506967;
  auVar57._8_4_ = 0x3ab743ce;
  auVar57._0_8_ = 0x3ab743ce3ab743ce;
  auVar57._12_4_ = 0x3ab743ce;
  auVar59._8_4_ = 0x3c088908;
  auVar59._0_8_ = 0x3c0889083c088908;
  auVar59._12_4_ = 0x3c088908;
  auVar61._8_4_ = 0x3d2aa9c1;
  auVar61._0_8_ = 0x3d2aa9c13d2aa9c1;
  auVar61._12_4_ = 0x3d2aa9c1;
  auVar63._8_4_ = 0x3e2aaaaa;
  auVar63._0_8_ = 0x3e2aaaaa3e2aaaaa;
  auVar63._12_4_ = 0x3e2aaaaa;
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = 0x3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  for (; iVar15 + 3 < iVar17; iVar15 = iVar15 + 4) {
    auVar22 = vsubps_avx(*(undefined1 (*) [16])*pauVar16,auVar24);
    auVar22 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar22,auVar25);
    auVar21 = vfmadd231ps_fma(auVar44,auVar22,auVar46);
    auVar19 = vcvttps2dq_avx512vl(auVar21);
    auVar19 = vcvtdq2ps_avx512vl(auVar19);
    uVar2 = vcmpps_avx512vl(auVar21,auVar19,1);
    auVar20 = vaddps_avx512vl(auVar19,auVar49);
    bVar1 = (bool)((byte)uVar2 & 1);
    auVar21._0_4_ = (uint)bVar1 * auVar20._0_4_ | (uint)!bVar1 * auVar19._0_4_;
    bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
    auVar21._4_4_ = (uint)bVar1 * auVar20._4_4_ | (uint)!bVar1 * auVar19._4_4_;
    bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
    auVar21._8_4_ = (uint)bVar1 * auVar20._8_4_ | (uint)!bVar1 * auVar19._8_4_;
    bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
    auVar21._12_4_ = (uint)bVar1 * auVar20._12_4_ | (uint)!bVar1 * auVar19._12_4_;
    auVar22 = vfmsub231ps_avx512vl(auVar22,auVar21,auVar51);
    auVar22 = vfmsub231ps_avx512vl(auVar22,auVar21,auVar53);
    auVar20._0_4_ = auVar22._0_4_ * auVar22._0_4_;
    auVar20._4_4_ = auVar22._4_4_ * auVar22._4_4_;
    auVar20._8_4_ = auVar22._8_4_ * auVar22._8_4_;
    auVar20._12_4_ = auVar22._12_4_ * auVar22._12_4_;
    auVar19 = vfmadd213ps_avx512vl(auVar55,auVar22,auVar57);
    auVar19 = vfmadd213ps_avx512vl(auVar19,auVar22,auVar59);
    auVar19 = vfmadd213ps_avx512vl(auVar19,auVar22,auVar61);
    auVar19 = vfmadd213ps_avx512vl(auVar19,auVar22,auVar63);
    auVar19 = vfmadd213ps_avx512vl(auVar19,auVar22,auVar44);
    auVar19 = vfmadd213ps_avx512vl(auVar19,auVar20,auVar22);
    auVar22 = vcvttps2dq_avx512vl(auVar21);
    auVar22 = vpslld_avx(auVar22,0x17);
    auVar22 = vpaddd_avx(auVar22,auVar65);
    auVar22 = vfmadd213ps_avx512vl(auVar22,auVar19,auVar22);
    *(undefined1 (*) [16])*pauVar16 = auVar22;
    auVar18 = vaddps_avx512vl(auVar22,auVar18);
    pauVar16 = (undefined1 (*) [64])(*pauVar16 + 0x10);
  }
  fVar48 = 0.0;
  auVar24 = auVar68._0_16_;
  for (; iVar15 < iVar17; iVar15 = iVar15 + 1) {
    auVar23 = vsubss_avx512f(ZEXT416(*(uint *)*pauVar16),auVar68._0_16_);
    fVar40 = expf(auVar23._0_4_);
    auVar68 = ZEXT1664(auVar24);
    *(float *)*pauVar16 = fVar40;
    fVar48 = fVar40 + fVar48;
    pauVar16 = (undefined1 (*) [64])(*pauVar16 + 4);
  }
  if (elempack == 0x10) {
    auVar33 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar69 = vdivps_avx512f(auVar33,auVar69);
  }
  else if (elempack == 8) {
    auVar32 = vextractf64x4_avx512f(auVar69,1);
    auVar26 = vaddps_avx512vl(auVar69._0_32_,auVar31);
    auVar31._0_4_ = auVar26._0_4_ + auVar32._0_4_;
    auVar31._4_4_ = auVar26._4_4_ + auVar32._4_4_;
    auVar31._8_4_ = auVar26._8_4_ + auVar32._8_4_;
    auVar31._12_4_ = auVar26._12_4_ + auVar32._12_4_;
    auVar31._16_4_ = auVar26._16_4_ + auVar32._16_4_;
    auVar31._20_4_ = auVar26._20_4_ + auVar32._20_4_;
    auVar31._24_4_ = auVar26._24_4_ + auVar32._24_4_;
    auVar31._28_4_ = auVar26._28_4_ + auVar32._28_4_;
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = 0x3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    auVar30._16_4_ = 0x3f800000;
    auVar30._20_4_ = 0x3f800000;
    auVar30._24_4_ = 0x3f800000;
    auVar30._28_4_ = 0x3f800000;
    auVar31 = vdivps_avx512vl(auVar30,auVar31);
    auVar69 = vinsertf64x4_avx512f(ZEXT3264(auVar31),auVar31,1);
  }
  if (bVar3) {
    auVar32 = vextractf64x4_avx512f(auVar69,1);
    auVar26 = vaddps_avx512vl(auVar69._0_32_,auVar31);
    auVar22._0_4_ = auVar26._0_4_ + auVar32._0_4_;
    auVar22._4_4_ = auVar26._4_4_ + auVar32._4_4_;
    auVar22._8_4_ = auVar26._8_4_ + auVar32._8_4_;
    auVar22._12_4_ = auVar26._12_4_ + auVar32._12_4_;
    auVar24 = vaddps_avx512vl(auVar22,auVar18);
    auVar19._8_4_ = 0x3f800000;
    auVar19._0_8_ = 0x3f8000003f800000;
    auVar19._12_4_ = 0x3f800000;
    auVar18._0_4_ = auVar24._0_4_ + auVar26._16_4_ + auVar32._16_4_;
    auVar18._4_4_ = auVar24._4_4_ + auVar26._20_4_ + auVar32._20_4_;
    auVar18._8_4_ = auVar24._8_4_ + auVar26._24_4_ + auVar32._24_4_;
    auVar18._12_4_ = auVar24._12_4_ + auVar26._28_4_ + auVar32._28_4_;
    auVar18 = vdivps_avx512vl(auVar19,auVar18);
    auVar31 = vinsertf32x4_avx512vl(ZEXT1632(auVar18),auVar18,1);
    auVar69 = vshuff64x2_avx512f(ZEXT1664(auVar18),ZEXT1664(auVar18),0);
  }
  if (bVar4) {
    auVar32 = vextractf64x4_avx512f(auVar69,1);
    auVar32 = vaddps_avx512vl(auVar69._0_32_,auVar32);
    auVar41._0_4_ = auVar32._0_4_ + auVar32._16_4_;
    auVar41._4_4_ = auVar32._4_4_ + auVar32._20_4_;
    auVar41._8_4_ = auVar32._8_4_ + auVar32._24_4_;
    auVar41._12_4_ = auVar32._12_4_ + auVar32._28_4_;
    auVar24 = vextractf32x4_avx512vl(auVar31,1);
    auVar23 = vaddps_avx512vl(auVar24,auVar31._0_16_);
    auVar24 = vshufpd_avx512vl(auVar18,auVar18,1);
    auVar25 = vaddps_avx512vl(auVar24,auVar18);
    auVar18 = vmovshdup_avx(auVar25);
    auVar24 = vshufps_avx(auVar41,auVar23,0x11);
    auVar23 = vshufps_avx(auVar41,auVar23,0xbb);
    auVar42._0_4_ = auVar23._0_4_ + auVar24._0_4_;
    auVar42._4_4_ = auVar23._4_4_ + auVar24._4_4_;
    auVar42._8_4_ = auVar23._8_4_ + auVar24._8_4_;
    auVar42._12_4_ = auVar23._12_4_ + auVar24._12_4_;
    auVar24 = vshufpd_avx(auVar42,auVar42,1);
    auVar43._0_4_ = auVar42._0_4_ + auVar24._0_4_;
    auVar43._4_4_ = auVar42._4_4_ + auVar24._4_4_;
    auVar43._8_4_ = auVar42._8_4_ + auVar24._8_4_;
    auVar43._12_4_ = auVar42._12_4_ + auVar24._12_4_;
    auVar24 = vhaddps_avx(auVar43,auVar43);
    fVar48 = 1.0 / (auVar18._0_4_ + auVar25._0_4_ + fVar48 + auVar24._0_4_);
    auVar69 = vbroadcastss_avx512f(ZEXT416((uint)fVar48));
    auVar18 = auVar69._0_16_;
    auVar31 = auVar69._0_32_;
  }
  for (iVar15 = 0; iVar15 + 0xf < iVar17; iVar15 = iVar15 + 0x10) {
    auVar33 = vmulps_avx512f(auVar69,*(undefined1 (*) [64])_ptr);
    *(undefined1 (*) [64])_ptr = auVar33;
    _ptr = (float *)((long)_ptr + 0x40);
  }
  for (; iVar15 + 7 < iVar17; iVar15 = iVar15 + 8) {
    auVar32 = vmulps_avx512vl(auVar31,*(undefined1 (*) [32])*(undefined1 (*) [64])_ptr);
    *(undefined1 (*) [32])*(undefined1 (*) [64])_ptr = auVar32;
    _ptr = (float *)(*(undefined1 (*) [64])_ptr + 0x20);
  }
  for (; iVar15 + 3 < iVar17; iVar15 = iVar15 + 4) {
    auVar24 = vmulps_avx512vl(auVar18,*(undefined1 (*) [16])*(undefined1 (*) [64])_ptr);
    *(undefined1 (*) [16])*(undefined1 (*) [64])_ptr = auVar24;
    _ptr = (float *)(*(undefined1 (*) [64])_ptr + 0x10);
  }
  for (; iVar15 < iVar17; iVar15 = iVar15 + 1) {
    *(float *)*(undefined1 (*) [64])_ptr = fVar48 * *(float *)*(undefined1 (*) [64])_ptr;
    _ptr = (float *)(*(undefined1 (*) [64])_ptr + 4);
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int size, int stride)
{
    // reduce max
    float max = -FLT_MAX;
    {
        const float* ptr = _ptr;
        for (int i = 0; i < size; i++)
        {
            max = std::max(max, *ptr);
            ptr += stride;
        }
    }

    // reduce exp(x - max)
    float sum = 0.f;
    {
        float* ptr = _ptr;
        for (int i = 0; i < size; i++)
        {
            *ptr = expf(*ptr - max);
            sum += *ptr;
            ptr += stride;
        }
    }

    // div sum
    {
        float* ptr = _ptr;
        for (int i = 0; i < size; i++)
        {
            *ptr /= sum;
            ptr += stride;
        }
    }
}